

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O2

uint32_t ans_fold_mapping<3u>(uint32_t x)

{
  int iVar1;
  
  iVar1 = 0;
  for (; 0x3ff < x; x = x >> 8) {
    iVar1 = iVar1 + 0x3fc;
  }
  return x + iVar1;
}

Assistant:

uint32_t ans_fold_mapping(uint32_t x)
{
    const uint32_t radix = 8;
    uint32_t radix_mask = ((1 << radix) - 1);
    size_t offset = 0;
    size_t thres = 1 << (fidelity + radix - 1);
    while (x >= thres) {
        auto digit = x & radix_mask;
        x = x >> radix;
        offset = offset + (1 << (fidelity - 1)) * radix_mask;
    }
    return x + offset;
}